

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

QRegion * __thiscall QRegion::operator+=(QRegion *this,QRegion *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QRegionPrivate *pQVar4;
  QRegionPrivate *r_00;
  bool bVar5;
  QRect *pQVar6;
  QRect *pQVar7;
  
  pQVar4 = this->d->qt_rgn;
  if ((pQVar4 != (QRegionPrivate *)0x0) && (pQVar4->numRects != 0)) {
    r_00 = r->d->qt_rgn;
    if (r_00 == (QRegionPrivate *)0x0) {
      return this;
    }
    if (this->d == r->d) {
      return this;
    }
    if (r_00->numRects == 0) {
      return this;
    }
    if (((((pQVar4->innerRect).x1.m_i <= (r_00->extents).x1.m_i) &&
         ((r_00->extents).x2.m_i <= (pQVar4->innerRect).x2.m_i)) &&
        ((pQVar4->innerRect).y1.m_i <= (r_00->extents).y1.m_i)) &&
       ((r_00->extents).y2.m_i <= (pQVar4->innerRect).y2.m_i)) {
      return this;
    }
    if ((((pQVar4->extents).x1.m_i < (r_00->innerRect).x1.m_i) ||
        ((r_00->innerRect).x2.m_i < (pQVar4->extents).x2.m_i)) ||
       (((pQVar4->extents).y1.m_i < (r_00->innerRect).y1.m_i ||
        ((r_00->innerRect).y2.m_i < (pQVar4->extents).y2.m_i)))) {
      if (r_00->numRects == 1) {
        pQVar6 = &r_00->extents;
      }
      else {
        pQVar6 = (r_00->rects).d.ptr;
      }
      pQVar7 = (pQVar4->rects).d.ptr + (long)pQVar4->numRects + -1;
      if ((long)pQVar4->numRects == 1) {
        pQVar7 = &pQVar4->extents;
      }
      iVar1 = (pQVar6->y1).m_i;
      iVar2 = (pQVar7->y2).m_i;
      if ((iVar2 < iVar1) ||
         (((iVar3 = (pQVar7->y1).m_i, iVar1 == iVar3 && ((pQVar6->y2).m_i - iVar1 == iVar2 - iVar3))
          && ((pQVar7->x2).m_i < (pQVar6->x1).m_i)))) {
        detach(this);
        QRegionPrivate::append(this->d->qt_rgn,r->d->qt_rgn);
        return this;
      }
      bVar5 = QRegionPrivate::canPrepend(pQVar4,r_00);
      if (bVar5) {
        detach(this);
        QRegionPrivate::prepend(this->d->qt_rgn,r->d->qt_rgn);
        return this;
      }
      bVar5 = EqualRegion(this->d->qt_rgn,r->d->qt_rgn);
      if (bVar5) {
        return this;
      }
      detach(this);
      pQVar4 = this->d->qt_rgn;
      UnionRegion(pQVar4,r->d->qt_rgn,pQVar4);
      return this;
    }
  }
  operator=(this,r);
  return this;
}

Assistant:

QRegion& QRegion::operator+=(const QRegion &r)
{
    if (isEmptyHelper(d->qt_rgn))
        return *this = r;
    if (isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (d == r.d)
        return *this;

    if (d->qt_rgn->contains(*r.d->qt_rgn)) {
        return *this;
    } else if (r.d->qt_rgn->contains(*d->qt_rgn)) {
        return *this = r;
    } else if (d->qt_rgn->canAppend(r.d->qt_rgn)) {
        detach();
        d->qt_rgn->append(r.d->qt_rgn);
        return *this;
    } else if (d->qt_rgn->canPrepend(r.d->qt_rgn)) {
        detach();
        d->qt_rgn->prepend(r.d->qt_rgn);
        return *this;
    } else if (EqualRegion(d->qt_rgn, r.d->qt_rgn)) {
        return *this;
    } else {
        detach();
        UnionRegion(d->qt_rgn, r.d->qt_rgn, *d->qt_rgn);
        return *this;
    }
}